

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_observer.hpp
# Opt level: O0

void __thiscall
afsm::test::test_fsm_observer::
state_cleared<afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction::extended_query,afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>>>,afsm::state<afsm::test::connection_fsm_def::transaction::extended_query::parse,afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction::extended_query,afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>>>>>
          (test_fsm_observer *this,
          inner_state_machine<afsm::test::connection_fsm_def::transaction::extended_query,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>
          *param_1,state<afsm::test::connection_fsm_def::transaction::extended_query::parse,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction::extended_query,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>_>
                   *param_2)

{
  ansi_color val;
  ostream *poVar1;
  string local_68;
  string local_48;
  char local_26;
  char local_25;
  int local_24;
  state<afsm::test::connection_fsm_def::transaction::extended_query::parse,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction::extended_query,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>_>
  *local_20;
  state<afsm::test::connection_fsm_def::transaction::extended_query::parse,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction::extended_query,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>_>
  *param_2_local;
  inner_state_machine<afsm::test::connection_fsm_def::transaction::extended_query,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>
  *param_1_local;
  test_fsm_observer *this_local;
  
  local_20 = param_2;
  param_2_local =
       (state<afsm::test::connection_fsm_def::transaction::extended_query::parse,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction::extended_query,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>_>
        *)param_1;
  param_1_local =
       (inner_state_machine<afsm::test::connection_fsm_def::transaction::extended_query,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>
        *)this;
  val = psst::operator|(red,bright);
  poVar1 = psst::operator<<((ostream *)&std::cerr,val);
  local_24 = (int)std::setw(0x11);
  poVar1 = std::operator<<(poVar1,(_Setw)local_24);
  local_25 = (char)std::setfill<char>('*');
  poVar1 = std::operator<<(poVar1,local_25);
  poVar1 = std::operator<<(poVar1,"*");
  poVar1 = psst::operator<<(poVar1,clear);
  local_26 = (char)std::setfill<char>(' ');
  poVar1 = std::operator<<(poVar1,local_26);
  poVar1 = std::operator<<(poVar1,": State cleared ");
  psst::util::demangle<afsm::test::connection_fsm_def::transaction::extended_query::parse>();
  get_name_components_after(&local_48,&local_68,&this->def_name);
  poVar1 = std::operator<<(poVar1,(string *)&local_48);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  return;
}

Assistant:

void
    state_cleared(FSM const&, State const&) const noexcept
    {
        using ::psst::ansi_color;
        using ::psst::util::demangle;
        ::std::cerr
             << (ansi_color::red | ansi_color::bright)
             << ::std::setw(event_name_width) << ::std::setfill('*')
             << "*" << ansi_color::clear  << ::std::setfill(' ')
             << ": State cleared "
             << get_name_components_after(
                 demangle< typename State::state_definition_type >(),
                 def_name) <<"\n";
    }